

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  CURLMcode CVar1;
  
  CVar1 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar1 = CURLM_RECURSIVE_API_CALL, (multi->field_0x1b1 & 4) == 0)) {
    multi_timeout(multi,timeout_ms);
    CVar1 = CURLM_OK;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_timeout(struct Curl_multi *multi,
                             long *timeout_ms)
{
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  return multi_timeout(multi, timeout_ms);
}